

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

void __thiscall groundupdbext::FileKeyValueStore::clear(FileKeyValueStore *this)

{
  bool bVar1;
  pointer pIVar2;
  path local_70;
  path local_38;
  FileKeyValueStore *local_10;
  FileKeyValueStore *this_local;
  
  local_10 = this;
  pIVar2 = std::
           unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_38,&pIVar2->m_fullpath,auto_format);
  bVar1 = std::filesystem::exists(&local_38);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_38);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
             ::operator->(&this->mImpl);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_70,&pIVar2->m_fullpath,auto_format);
    std::filesystem::remove_all(&local_70);
    Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_70);
  }
  return;
}

Assistant:

void
FileKeyValueStore::clear()
{
  if (fs::exists(mImpl->m_fullpath)) {
      fs::remove_all(mImpl->m_fullpath);
  }
}